

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_map_suite.cpp
# Opt level: O2

void api_suite::api_lower_bound(void)

{
  const_iterator pvVar1;
  const_iterator pvVar2;
  value_type local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  constant_map<int,_int,_4UL,_std::less<int>_> map;
  
  local_58 = 0x300000021;
  uStack_50 = 0x10000000b;
  local_68.first = 0x16;
  local_68.second = 2;
  uStack_60 = 0x40000002c;
  vista::constant_map<int,_int,_4UL,_std::less<int>_>::constant_map
            (&map,(value_type (*) [4])&local_68);
  local_68.first = 10;
  pvVar1 = vista::constant_map<int,_int,_4UL,_std::less<int>_>::lower_bound(&map,&local_68.first);
  boost::detail::test_impl
            ("map.lower_bound(10) == map.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x78,"void api_suite::api_lower_bound()",pvVar1 == (const_iterator)&map);
  local_68.first = 0xb;
  pvVar1 = vista::constant_map<int,_int,_4UL,_std::less<int>_>::lower_bound(&map,&local_68.first);
  boost::detail::test_impl
            ("map.lower_bound(11) == map.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x79,"void api_suite::api_lower_bound()",pvVar1 == (const_iterator)&map);
  local_68.first = 0xc;
  pvVar2 = vista::constant_map<int,_int,_4UL,_std::less<int>_>::lower_bound(&map,&local_68.first);
  pvVar1 = map.super_array<vista::pair<int,_int>,_4UL>._M_elems + 1;
  boost::detail::test_impl
            ("map.lower_bound(12) == map.begin() + 1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x7a,"void api_suite::api_lower_bound()",pvVar2 == pvVar1);
  local_68.first = 0x16;
  pvVar2 = vista::constant_map<int,_int,_4UL,_std::less<int>_>::lower_bound(&map,&local_68.first);
  boost::detail::test_impl
            ("map.lower_bound(22) == map.begin() + 1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x7b,"void api_suite::api_lower_bound()",pvVar2 == pvVar1);
  local_68.first = 0x17;
  pvVar2 = vista::constant_map<int,_int,_4UL,_std::less<int>_>::lower_bound(&map,&local_68.first);
  pvVar1 = map.super_array<vista::pair<int,_int>,_4UL>._M_elems + 2;
  boost::detail::test_impl
            ("map.lower_bound(23) == map.begin() + 2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x7c,"void api_suite::api_lower_bound()",pvVar2 == pvVar1);
  local_68.first = 0x21;
  pvVar2 = vista::constant_map<int,_int,_4UL,_std::less<int>_>::lower_bound(&map,&local_68.first);
  boost::detail::test_impl
            ("map.lower_bound(33) == map.begin() + 2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x7d,"void api_suite::api_lower_bound()",pvVar2 == pvVar1);
  local_68.first = 0x22;
  pvVar2 = vista::constant_map<int,_int,_4UL,_std::less<int>_>::lower_bound(&map,&local_68.first);
  pvVar1 = map.super_array<vista::pair<int,_int>,_4UL>._M_elems + 3;
  boost::detail::test_impl
            ("map.lower_bound(34) == map.begin() + 3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x7e,"void api_suite::api_lower_bound()",pvVar2 == pvVar1);
  local_68.first = 0x2c;
  pvVar2 = vista::constant_map<int,_int,_4UL,_std::less<int>_>::lower_bound(&map,&local_68.first);
  boost::detail::test_impl
            ("map.lower_bound(44) == map.begin() + 3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x7f,"void api_suite::api_lower_bound()",pvVar2 == pvVar1);
  local_68.first = 0x2d;
  pvVar1 = vista::constant_map<int,_int,_4UL,_std::less<int>_>::lower_bound(&map,&local_68.first);
  boost::detail::test_impl
            ("map.lower_bound(45) == map.end()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x80,"void api_suite::api_lower_bound()",
             pvVar1 == (const_iterator)&stack0xffffffffffffffd8);
  return;
}

Assistant:

void api_lower_bound()
{
    auto map = make_constant_map<int, int>(
        {
            { 22, 2 },
            { 44, 4 },
            { 33, 3 },
            { 11, 1 }
        });
    BOOST_TEST(map.lower_bound(10) == map.begin());
    BOOST_TEST(map.lower_bound(11) == map.begin());
    BOOST_TEST(map.lower_bound(12) == map.begin() + 1);
    BOOST_TEST(map.lower_bound(22) == map.begin() + 1);
    BOOST_TEST(map.lower_bound(23) == map.begin() + 2);
    BOOST_TEST(map.lower_bound(33) == map.begin() + 2);
    BOOST_TEST(map.lower_bound(34) == map.begin() + 3);
    BOOST_TEST(map.lower_bound(44) == map.begin() + 3);
    BOOST_TEST(map.lower_bound(45) == map.end());
}